

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlatMap.h
# Opt level: O2

ChunkDrawable * __thiscall
FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_>::at
          (FlatMap<unsigned_long,_ChunkDrawable,_std::less<unsigned_long>_> *this,unsigned_long *key
          )

{
  iterator iVar1;
  out_of_range *this_00;
  
  iVar1 = find(this,key);
  if (iVar1._M_current !=
      (this->vec_).
      super__Vector_base<std::pair<unsigned_long,_ChunkDrawable>,_std::allocator<std::pair<unsigned_long,_ChunkDrawable>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    return &(iVar1._M_current)->second;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
  std::out_of_range::out_of_range(this_00,"FlatMap::at");
  __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
}

Assistant:

T& at(const Key& key) {
        auto val = find(key);
        if (val == vec_.end()) {
            throw std::out_of_range("FlatMap::at");
        }
        return val->second;
    }